

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O3

void __thiscall
Assimp::IFC::anon_unknown_9::CompositeCurve::SampleDiscrete
          (CompositeCurve *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  pointer ppVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  undefined4 extraout_var;
  pointer paVar7;
  pointer paVar8;
  pointer paVar9;
  long lVar10;
  CurveEntry *entry;
  pointer ppVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  IfcFloat IVar12;
  
  IVar12 = b;
  (*(this->super_BoundedCurve).super_Curve._vptr_Curve[5])();
  iVar6 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[2])(this);
  if (((char)iVar6 == '\0') &&
     ((a - (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <= -1.1920928955078125e-07 ||
      (IVar12 - a <= -1.1920928955078125e-07)))) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x119,
                  "virtual void Assimp::IFC::(anonymous namespace)::CompositeCurve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  IVar12 = a;
  (*(this->super_BoundedCurve).super_Curve._vptr_Curve[5])(this);
  iVar6 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[2])(this);
  if (((char)iVar6 == '\0') &&
     ((b - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) <= -1.1920928955078125e-07 ||
      (IVar12 - b <= -1.1920928955078125e-07)))) {
    __assert_fail("InRange( b )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x11a,
                  "virtual void Assimp::IFC::(anonymous namespace)::CompositeCurve::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  iVar6 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[6])(SUB84(a,0),this);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&out->mVerts,
             ((long)(out->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(out->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
             CONCAT44(extraout_var,iVar6));
  ppVar1 = (this->curves).
           super__Vector_base<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar11 = (this->curves).
                 super__Vector_base<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar1; ppVar11 = ppVar11 + 1
      ) {
    lVar10 = (long)(out->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(out->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    BoundedCurve::SampleDiscrete
              ((ppVar11->first).
               super___shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2>._M_ptr,out)
    ;
    if (ppVar11->second == false) {
      paVar9 = (out->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar8 = (out->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((lVar10 != (long)paVar8 - (long)paVar9) &&
         (paVar7 = paVar8 + -1,
         (pointer)((long)paVar9 + lVar10) < paVar7 && (pointer)((long)paVar9 + lVar10) != paVar8)) {
        paVar9 = (pointer)((long)paVar9 + lVar10);
        do {
          paVar8 = paVar9 + 1;
          dVar2 = paVar9->z;
          dVar3 = paVar9->x;
          dVar4 = paVar9->y;
          paVar9->z = paVar7->z;
          dVar5 = paVar7->y;
          paVar9->x = paVar7->x;
          paVar9->y = dVar5;
          paVar7->z = dVar2;
          paVar7->x = dVar3;
          paVar7->y = dVar4;
          paVar7 = paVar7 + -1;
          paVar9 = paVar8;
        } while (paVar8 < paVar7);
      }
    }
  }
  return;
}

Assistant:

void SampleDiscrete(TempMesh& out,IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );

        const size_t cnt = EstimateSampleCount(a,b);
        out.mVerts.reserve(out.mVerts.size() + cnt);

        for(const CurveEntry& entry : curves) {
            const size_t cnt = out.mVerts.size();
            entry.first->SampleDiscrete(out);

            if (!entry.second && cnt != out.mVerts.size()) {
                std::reverse(out.mVerts.begin()+cnt,out.mVerts.end());
            }
        }
    }